

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

Amount __thiscall
cfd::ConfidentialTransactionController::CalculateSimpleFee
          (ConfidentialTransactionController *this,bool append_feature_signed_size,
          bool append_signed_witness)

{
  uint32_t size;
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  undefined7 in_register_00000031;
  ConfidentialTransaction *this_00;
  Amount AVar4;
  
  this_00 = &this->transaction_;
  size = core::ConfidentialTransaction::GetTotalSize(this_00);
  uVar1 = core::ConfidentialTransaction::GetVsize(this_00);
  if ((int)CONCAT71(in_register_00000031,append_feature_signed_size) != 0) {
    uVar1 = core::ConfidentialTransaction::GetWeight(this_00);
    uVar2 = core::ConfidentialTransaction::GetTxInCount(this_00);
    iVar3 = 0x1b0;
    if (append_signed_witness) {
      iVar3 = 0x6c;
    }
    size = size + iVar3 * uVar2;
    uVar1 = uVar1 + iVar3 * uVar2 + 3 >> 2;
  }
  AVar4 = FeeCalculator::CalculateFee(size,uVar1,1000);
  return AVar4;
}

Assistant:

Amount ConfidentialTransactionController::CalculateSimpleFee(
    bool append_feature_signed_size, bool append_signed_witness) const {
  static constexpr uint32_t kP2wpkhWitnessSize = 72 + 33 + 3;
  // 簡易計算
  uint32_t size = transaction_.GetTotalSize();
  uint32_t vsize = transaction_.GetVsize();
  uint32_t rate = FeeCalculator::kRelayMinimumFee;
  if (append_feature_signed_size) {
    uint32_t weight = transaction_.GetWeight();
    uint32_t count = transaction_.GetTxInCount();
    uint32_t add_size;
    add_size = kP2wpkhWitnessSize * count;
    if (!append_signed_witness) {
      // no segwit (x4)
      add_size *= 4;
    }
    size += add_size;
    weight += add_size;
    vsize = (weight + 3) / 4;  // wally_tx_vsize_from_weight
  }
  return FeeCalculator::CalculateFee(size, vsize, rate);
}